

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_vexp_fun.c
# Opt level: O2

void ex_abs(t_expr *e,long argc,ex_ex *argv,ex_ex *optr)

{
  int iVar1;
  t_float *ptVar2;
  t_float *ptVar3;
  long lVar4;
  float fVar5;
  
  lVar4 = argv->ex_type;
  if (lVar4 - 0xeU < 2) {
    if (optr->ex_type == 0xf) {
      ptVar3 = (optr->ex_cont).v_vec;
    }
    else {
      optr->ex_type = 0xf;
      ptVar3 = (t_float *)malloc((long)e->exp_vsize << 2);
      (optr->ex_cont).v_vec = ptVar3;
    }
    ptVar2 = (argv->ex_cont).v_vec;
    iVar1 = e->exp_vsize;
    for (lVar4 = 0; iVar1 != (int)lVar4; lVar4 = lVar4 + 1) {
      ptVar3[lVar4] = ABS(ptVar2[lVar4]);
    }
    return;
  }
  if (lVar4 == 2) {
    if (optr->ex_type != 0xf) {
      optr->ex_type = 2;
      (optr->ex_cont).v_flt = ABS((argv->ex_cont).v_flt);
      return;
    }
    ptVar3 = (optr->ex_cont).v_vec;
    fVar5 = (argv->ex_cont).v_flt;
  }
  else {
    if (lVar4 != 1) {
      pd_error(e,"expr: FUNV_EVAL_UNARY(%d): bad left type %ld\n",0x3e9);
      return;
    }
    if (optr->ex_type != 0xf) {
      optr->ex_type = 1;
      optr->ex_cont =
           (anon_union_8_5_735de1bb_for_ex_cont)(long)(int)ABS((double)(argv->ex_cont).v_int);
      return;
    }
    ptVar3 = (optr->ex_cont).v_vec;
    fVar5 = (float)(argv->ex_cont).v_int;
  }
  ex_mkvector(ptVar3,ABS(fVar5),e->exp_vsize);
  return;
}

Assistant:

static void
ex_abs(t_expr *e, long int argc, struct ex_ex *argv, struct ex_ex *optr)
{
        struct ex_ex *left;
        t_float *op; /* output pointer */
        t_float *lp, *rp;         /* left and right vector pointers */
        t_float scalar;
        int j;

        left = argv++;

        FUNC_EVAL_UNARY(left, fabs, (double), optr, 0);
}